

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::Resize(RepeatedField<int> *this,int new_size,int *value)

{
  int iVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    auVar5 = _DAT_0024e950;
    auVar4 = _DAT_0024e940;
    auVar3 = _DAT_0024e930;
    lVar7 = (long)this->current_size_;
    if (this->current_size_ != new_size) {
      iVar1 = *value;
      pvVar2 = this->arena_or_elements_;
      uVar6 = ((long)new_size * 4 + lVar7 * -4) - 4;
      auVar12._8_4_ = (int)uVar6;
      auVar12._0_8_ = uVar6;
      auVar12._12_4_ = (int)(uVar6 >> 0x20);
      auVar9._0_8_ = uVar6 >> 2;
      auVar9._8_8_ = auVar12._8_8_ >> 2;
      uVar8 = 0;
      auVar9 = auVar9 ^ _DAT_0024e950;
      do {
        auVar11._8_4_ = (int)uVar8;
        auVar11._0_8_ = uVar8;
        auVar11._12_4_ = (int)(uVar8 >> 0x20);
        auVar12 = (auVar11 | auVar4) ^ auVar5;
        iVar10 = auVar9._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ ||
                    iVar10 < auVar12._4_4_) & 1)) {
          *(int *)((long)pvVar2 + uVar8 * 4 + lVar7 * 4) = iVar1;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          *(int *)((long)pvVar2 + uVar8 * 4 + lVar7 * 4 + 4) = iVar1;
        }
        auVar12 = (auVar11 | auVar3) ^ auVar5;
        iVar13 = auVar12._4_4_;
        if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar12._0_4_ <= auVar9._0_4_)) {
          *(int *)((long)pvVar2 + uVar8 * 4 + lVar7 * 4 + 8) = iVar1;
          *(int *)((long)pvVar2 + uVar8 * 4 + lVar7 * 4 + 0xc) = iVar1;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}